

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTests.cpp
# Opt level: O3

void __thiscall
ParserTest_InvalidFunctionDeclarationThrows_Test::TestBody
          (ParserTest_InvalidFunctionDeclarationThrows_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_1a0;
  function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> local_180;
  function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> local_160;
  function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> local_140;
  function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> local_120;
  function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> local_100;
  function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> local_e0;
  function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> local_c0;
  function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> local_a0;
  function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> local_80;
  function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> local_60;
  function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> local_40;
  
  paVar1 = &local_1a0.field_2;
  local_1a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"t(x: f32): f32 { }","");
  local_40.super__Function_base._M_functor._M_unused._M_object = Parser::parseFunctionDeclaration;
  local_40.super__Function_base._M_functor._8_8_ = 0;
  local_40._M_invoker =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_invoke;
  local_40.super__Function_base._M_manager =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_manager;
  testThrow(&local_1a0,&local_40);
  if (local_40.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_40.super__Function_base._M_manager)
              ((_Any_data *)&local_40,(_Any_data *)&local_40,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  local_1a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"fn (x:f32): f32 {}","");
  local_60.super__Function_base._M_functor._M_unused._M_object = Parser::parseFunctionDeclaration;
  local_60.super__Function_base._M_functor._8_8_ = 0;
  local_60._M_invoker =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_invoke;
  local_60.super__Function_base._M_manager =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_manager;
  testThrow(&local_1a0,&local_60);
  if (local_60.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_60.super__Function_base._M_manager)
              ((_Any_data *)&local_60,(_Any_data *)&local_60,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  local_1a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"fn t :f32): f32 {}","");
  local_80.super__Function_base._M_functor._M_unused._M_object = Parser::parseFunctionDeclaration;
  local_80.super__Function_base._M_functor._8_8_ = 0;
  local_80._M_invoker =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_invoke;
  local_80.super__Function_base._M_manager =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_manager;
  testThrow(&local_1a0,&local_80);
  if (local_80.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_80.super__Function_base._M_manager)
              ((_Any_data *)&local_80,(_Any_data *)&local_80,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  local_1a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"fn t(x f32) :f32 {}","");
  local_a0.super__Function_base._M_functor._M_unused._M_object = Parser::parseFunctionDeclaration;
  local_a0.super__Function_base._M_functor._8_8_ = 0;
  local_a0._M_invoker =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_invoke;
  local_a0.super__Function_base._M_manager =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_manager;
  testThrow(&local_1a0,&local_a0);
  if (local_a0.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_a0.super__Function_base._M_manager)
              ((_Any_data *)&local_a0,(_Any_data *)&local_a0,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  local_1a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"fn f(x: f32) f32 {}","");
  local_c0.super__Function_base._M_functor._M_unused._M_object = Parser::parseFunctionDeclaration;
  local_c0.super__Function_base._M_functor._8_8_ = 0;
  local_c0._M_invoker =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_invoke;
  local_c0.super__Function_base._M_manager =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_manager;
  testThrow(&local_1a0,&local_c0);
  if (local_c0.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_c0.super__Function_base._M_manager)
              ((_Any_data *)&local_c0,(_Any_data *)&local_c0,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  local_1a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"fn f(x: f32) : {}","");
  local_e0.super__Function_base._M_functor._M_unused._M_object = Parser::parseFunctionDeclaration;
  local_e0.super__Function_base._M_functor._8_8_ = 0;
  local_e0._M_invoker =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_invoke;
  local_e0.super__Function_base._M_manager =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_manager;
  testThrow(&local_1a0,&local_e0);
  if (local_e0.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_e0.super__Function_base._M_manager)
              ((_Any_data *)&local_e0,(_Any_data *)&local_e0,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  local_1a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"fn f(x: f32, ): f32 {}","");
  local_100.super__Function_base._M_functor._M_unused._M_object = Parser::parseFunctionDeclaration;
  local_100.super__Function_base._M_functor._8_8_ = 0;
  local_100._M_invoker =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_invoke;
  local_100.super__Function_base._M_manager =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_manager;
  testThrow(&local_1a0,&local_100);
  if (local_100.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_100.super__Function_base._M_manager)
              ((_Any_data *)&local_100,(_Any_data *)&local_100,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  local_1a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1a0,"fn f(x: f32, y) : f32 {}","");
  local_120.super__Function_base._M_functor._M_unused._M_object = Parser::parseFunctionDeclaration;
  local_120.super__Function_base._M_functor._8_8_ = 0;
  local_120._M_invoker =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_invoke;
  local_120.super__Function_base._M_manager =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_manager;
  testThrow(&local_1a0,&local_120);
  if (local_120.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_120.super__Function_base._M_manager)
              ((_Any_data *)&local_120,(_Any_data *)&local_120,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  local_1a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"fn f(x: f32) : f32","");
  local_140.super__Function_base._M_functor._M_unused._M_object = Parser::parseFunctionDeclaration;
  local_140.super__Function_base._M_functor._8_8_ = 0;
  local_140._M_invoker =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_invoke;
  local_140.super__Function_base._M_manager =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_manager;
  testThrow(&local_1a0,&local_140);
  if (local_140.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_140.super__Function_base._M_manager)
              ((_Any_data *)&local_140,(_Any_data *)&local_140,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  local_1a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"fn f(x: f32) : f32 {","");
  local_160.super__Function_base._M_functor._M_unused._M_object = Parser::parseFunctionDeclaration;
  local_160.super__Function_base._M_functor._8_8_ = 0;
  local_160._M_invoker =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_invoke;
  local_160.super__Function_base._M_manager =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_manager;
  testThrow(&local_1a0,&local_160);
  if (local_160.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_160.super__Function_base._M_manager)
              ((_Any_data *)&local_160,(_Any_data *)&local_160,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  local_1a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"fn f(x: f32) : f32 }","");
  local_180.super__Function_base._M_functor._M_unused._M_object = Parser::parseFunctionDeclaration;
  local_180.super__Function_base._M_functor._8_8_ = 0;
  local_180._M_invoker =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_invoke;
  local_180.super__Function_base._M_manager =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<FunctionDeclarationNode,_std::default_delete<FunctionDeclarationNode>_>_(Parser::*)()>
       ::_M_manager;
  testThrow(&local_1a0,&local_180);
  if (local_180.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_180.super__Function_base._M_manager)
              ((_Any_data *)&local_180,(_Any_data *)&local_180,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(ParserTest, BinaryExpr)
{
  auto node = std::make_unique<BinaryOpNode>(
      std::make_unique<NumericLiteralNode>(2), 
      BinaryOperator::BinaryAnd, 
      std::make_unique<NumericLiteralNode>(3));
  setupTest("2 & 3", &Parser::parseArithmeticExpression, std::move(node));

  node = std::make_unique<BinaryOpNode>(
      std::make_unique<NumericLiteralNode>(5), 
      BinaryOperator::BinaryOr, 
      std::make_unique<NumericLiteralNode>(3));
  setupTest("5 | 3", &Parser::parseArithmeticExpression, std::move(node));

  node = std::make_unique<BinaryOpNode>(
      std::make_unique<VariableNode>("x"), 
      BinaryOperator::BinaryXor, 
      std::make_unique<NumericLiteralNode>(2));
  setupTest("x ^ 2", &Parser::parseArithmeticExpression, std::move(node));

  node = std::make_unique<BinaryOpNode>(
      std::make_unique<NumericLiteralNode>(1), 
      BinaryOperator::ShiftLeft, 
      std::make_unique<NumericLiteralNode>(2));
  setupTest("1 << 2", &Parser::parseArithmeticExpression, std::move(node));

  node = std::make_unique<BinaryOpNode>(
      std::make_unique<NumericLiteralNode>(1), 
      BinaryOperator::ShiftRight, 
      std::make_unique<NumericLiteralNode>(2));
  setupTest("1 >> 2", &Parser::parseArithmeticExpression, std::move(node));
}